

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.h
# Opt level: O2

void __thiscall
ByteCodeGenerator::PushJumpCleanupForLoop(ByteCodeGenerator *this,ParseNode *loopNode,uint loopId)

{
  JumpCleanupInfo local_28;
  
  local_28.tryOp = Nop;
  local_28.label = 0;
  local_28.regSlot1 = 0xffffffff;
  local_28.regSlot2 = 0xffffffff;
  local_28.loopNode = loopNode;
  local_28.loopId = loopId;
  DList<JumpCleanupInfo,_Memory::ArenaAllocator,_RealCount>::Prepend
            (this->jumpCleanupList,&local_28);
  return;
}

Assistant:

void PushJumpCleanupForLoop(ParseNode* loopNode, uint loopId)
    {
        this->jumpCleanupList->Prepend({
            loopNode,
            loopId,
            Js::OpCode::Nop,
            0,
            Js::Constants::NoRegister,
            Js::Constants::NoRegister
        });
    }